

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O0

vector<despot::State_*,_std::allocator<despot::State_*>_> * __thiscall
despot::FullChainBelief::Sample
          (vector<despot::State_*,_std::allocator<despot::State_*>_> *__return_storage_ptr__,
          FullChainBelief *this,int num_particles)

{
  int action_00;
  int state_00;
  ChainState *this_00;
  size_type sVar1;
  const_reference pvVar2;
  const_reference __x;
  ChainState *local_88;
  vector<double,_std::allocator<double>_> local_80;
  vector<double,_std::allocator<double>_> local_68;
  int local_4c;
  int local_48;
  ACT_TYPE action;
  int state;
  ChainState *local_38;
  ChainState *particle;
  undefined1 local_25;
  int i;
  int local_20;
  int num_mdp_actions;
  int num_mdp_states;
  int num_particles_local;
  FullChainBelief *this_local;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *samples;
  
  num_mdp_actions = num_particles;
  _num_mdp_states = this;
  this_local = (FullChainBelief *)__return_storage_ptr__;
  sVar1 = std::
          vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
          ::size(&this->alpha_);
  local_20 = (int)sVar1;
  pvVar2 = std::
           vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
           ::operator[](&this->alpha_,0);
  sVar1 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size(pvVar2);
  i = (int)sVar1;
  local_25 = 0;
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector(__return_storage_ptr__);
  for (particle._4_4_ = 0; particle._4_4_ < num_mdp_actions; particle._4_4_ = particle._4_4_ + 1) {
    local_38 = (ChainState *)
               (**(code **)(**(long **)&this->field_0x8 + 0xa8))
                         (1.0 / (double)num_mdp_actions,*(long **)&this->field_0x8,0xffffffff);
    ChainState::Init(local_38,local_20,i);
    local_38->mdp_state = this->cur_state_;
    for (local_48 = 0; local_48 < local_20; local_48 = local_48 + 1) {
      for (local_4c = 0; this_00 = local_38, state_00 = local_48, action_00 = local_4c, local_4c < i
          ; local_4c = local_4c + 1) {
        pvVar2 = std::
                 vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ::operator[](&this->alpha_,(long)local_48);
        __x = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[](pvVar2,(long)local_4c);
        std::vector<double,_std::allocator<double>_>::vector(&local_80,__x);
        despot::Dirichlet::Next(&local_68,&local_80);
        ChainState::SetTransition(this_00,state_00,action_00,&local_68);
        std::vector<double,_std::allocator<double>_>::~vector(&local_68);
        std::vector<double,_std::allocator<double>_>::~vector(&local_80);
      }
    }
    Chain::ComputeOptimalValue(*(Chain **)&this->field_0x8,local_38);
    local_88 = local_38;
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
              (__return_storage_ptr__,(value_type *)&local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<State*> FullChainBelief::Sample(int num_particles) const {
	int num_mdp_states = alpha_.size(), num_mdp_actions = alpha_[0].size();

	vector<State*> samples;
	for (int i = 0; i < num_particles; i++) {
		ChainState* particle = static_cast<ChainState*>(model_->Allocate(-1,
			1.0 / num_particles));
		particle->Init(num_mdp_states, num_mdp_actions);

		particle->mdp_state = cur_state_;
		for (int state = 0; state < num_mdp_states; state++) {
			for (ACT_TYPE action = 0; action < num_mdp_actions; action++) {
				particle->SetTransition(state, action,
					Dirichlet::Next(alpha_[state][action]));
			}
		}

		static_cast<const Chain*>(model_)->ComputeOptimalValue(*particle);
		samples.push_back(particle);
	}
	return samples;
}